

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FkCheck(Parse *pParse,Table *pTab,int regOld,int regNew,int *aChange,int bChngRowid)

{
  u8 uVar1;
  short sVar2;
  long lVar3;
  Table *pTVar4;
  i16 iVar5;
  int iVar6;
  SrcList *pSrc_00;
  int local_dc;
  int eAction;
  SrcItem *pItem;
  int *aiCol_1;
  SrcList *pSrc;
  Index *pIdx_1;
  char *zCol;
  int rcauth;
  int iReg;
  int iFromCol;
  int iJump;
  Vdbe *v;
  int local_80;
  int bIgnore;
  int i;
  int iCol;
  int *aiCol;
  int *aiFree;
  Index *pIdx;
  Table *pTo;
  char *pcStack_50;
  int isIgnoreErrors;
  char *zDb;
  FKey *pFStack_40;
  int iDb;
  FKey *pFKey;
  sqlite3 *db;
  int *piStack_28;
  int bChngRowid_local;
  int *aChange_local;
  int regNew_local;
  int regOld_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  pFKey = (FKey *)pParse->db;
  pTo._4_4_ = (uint)pParse->disableTriggers;
  if (((((sqlite3 *)pFKey)->flags & 0x4000) != 0) && (pTab->eTabType == '\0')) {
    db._4_4_ = bChngRowid;
    piStack_28 = aChange;
    aChange_local._0_4_ = regNew;
    aChange_local._4_4_ = regOld;
    _regNew_local = pTab;
    pTab_local = (Table *)pParse;
    zDb._4_4_ = sqlite3SchemaToIndex((sqlite3 *)pFKey,pTab->pSchema);
    pcStack_50 = *(char **)(pFKey->pPrevTo->aAction + (long)zDb._4_4_ * 0x20 + -0x2d);
    for (pFStack_40 = (_regNew_local->u).tab.pFKey; pFStack_40 != (FKey *)0x0;
        pFStack_40 = pFStack_40->pNextFrom) {
      aiFree = (int *)0x0;
      aiCol = (int *)0x0;
      v._4_4_ = 0;
      if (((piStack_28 == (int *)0x0) ||
          (iVar6 = sqlite3_stricmp(_regNew_local->zName,pFStack_40->zTo), iVar6 == 0)) ||
         (iVar6 = fkChildIsModified(_regNew_local,pFStack_40,piStack_28,db._4_4_), iVar6 != 0)) {
        if (*(char *)((long)&pTab_local[2].zName + 7) == '\0') {
          pIdx = (Index *)sqlite3LocateTable((Parse *)pTab_local,0,pFStack_40->zTo,pcStack_50);
        }
        else {
          pIdx = (Index *)sqlite3FindTable((sqlite3 *)pFKey,pFStack_40->zTo,pcStack_50);
        }
        if ((pIdx == (Index *)0x0) ||
           (iVar6 = sqlite3FkLocateIndex
                              ((Parse *)pTab_local,(Table *)pIdx,pFStack_40,(Index **)&aiFree,&aiCol
                              ), iVar6 != 0)) {
          if (pTo._4_4_ == 0) {
            return;
          }
          if (*(char *)((long)&pFKey[1].zTo + 7) != '\0') {
            return;
          }
          if (pIdx == (Index *)0x0) {
            _iFromCol = sqlite3GetVdbe((Parse *)pTab_local);
            iVar6 = sqlite3VdbeCurrentAddr(_iFromCol);
            iReg = iVar6 + pFStack_40->nCol + 1;
            for (local_80 = 0; local_80 < pFStack_40->nCol; local_80 = local_80 + 1) {
              rcauth = pFStack_40->aCol[local_80].iFrom;
              iVar5 = sqlite3TableColumnToStorage(pFStack_40->pFrom,(i16)rcauth);
              zCol._4_4_ = iVar5 + aChange_local._4_4_ + 1;
              sqlite3VdbeAddOp2(_iFromCol,0x32,zCol._4_4_,iReg);
            }
            sqlite3VdbeAddOp2(_iFromCol,0x9e,(uint)pFStack_40->isDeferred,-1);
          }
        }
        else {
          if (aiCol == (int *)0x0) {
            bIgnore = pFStack_40->aCol[0].iFrom;
            _i = &bIgnore;
          }
          else {
            _i = aiCol;
          }
          for (local_80 = 0; local_80 < pFStack_40->nCol; local_80 = local_80 + 1) {
            if (_i[local_80] == (int)_regNew_local->iPKey) {
              _i[local_80] = -1;
            }
            if (pFKey[6].zTo != (char *)0x0) {
              if (aiFree == (int *)0x0) {
                sVar2 = *(short *)((long)&pIdx->pSchema + 4);
              }
              else {
                sVar2 = *(short *)(*(long *)(aiFree + 2) + (long)local_80 * 2);
              }
              local_dc = (int)sVar2;
              pIdx_1 = *(Index **)(pIdx->aiColumn + (long)local_dc * 8);
              zCol._0_4_ = sqlite3AuthReadCol((Parse *)pTab_local,pIdx->zName,(char *)pIdx_1,
                                              zDb._4_4_);
              v._4_4_ = (uint)((int)zCol == 2);
            }
          }
          sqlite3TableLock((Parse *)pTab_local,zDb._4_4_,*(Pgno *)&pIdx->pNext,'\0',pIdx->zName);
          *(int *)&pTab_local->iPKey = *(int *)&pTab_local->iPKey + 1;
          if (aChange_local._4_4_ != 0) {
            fkLookupParent((Parse *)pTab_local,zDb._4_4_,(Table *)pIdx,(Index *)aiFree,pFStack_40,_i
                           ,aChange_local._4_4_,-1,v._4_4_);
          }
          if (((int)aChange_local != 0) &&
             (iVar6 = isSetNullAction((Parse *)pTab_local,pFStack_40), iVar6 == 0)) {
            fkLookupParent((Parse *)pTab_local,zDb._4_4_,(Table *)pIdx,(Index *)aiFree,pFStack_40,_i
                           ,(int)aChange_local,1,v._4_4_);
          }
          sqlite3DbFree((sqlite3 *)pFKey,aiCol);
        }
      }
    }
    for (pFStack_40 = sqlite3FkReferences(_regNew_local); pFStack_40 != (FKey *)0x0;
        pFStack_40 = pFStack_40->pNextTo) {
      pSrc = (SrcList *)0x0;
      pItem = (SrcItem *)0x0;
      if (((piStack_28 == (int *)0x0) ||
          (iVar6 = fkParentIsModified(_regNew_local,pFStack_40,piStack_28,db._4_4_), iVar6 != 0)) &&
         ((pFStack_40->isDeferred != '\0' ||
          (((((ulong)pFKey->apTrigger[0] & 0x80000) != 0 ||
            (lVar3._0_2_ = pTab_local[1].nNVCol, lVar3._2_2_ = pTab_local[1].nRowLogEst,
            lVar3._4_2_ = pTab_local[1].szTabRow, lVar3._6_1_ = pTab_local[1].keyConf,
            lVar3._7_1_ = pTab_local[1].eTabType, lVar3 != 0)) ||
           (*(char *)&pTab_local->pCheck != '\0')))))) {
        iVar6 = sqlite3FkLocateIndex
                          ((Parse *)pTab_local,_regNew_local,pFStack_40,(Index **)&pSrc,
                           (int **)&pItem);
        if (iVar6 == 0) {
          pSrc_00 = sqlite3SrcListAppend
                              ((Parse *)pTab_local,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
          aiCol_1 = &pSrc_00->nSrc;
          if (pSrc_00 != (SrcList *)0x0) {
            pSrc_00->a[0].pTab = pFStack_40->pFrom;
            pSrc_00->a[0].zName = pFStack_40->pFrom->zName;
            pTVar4 = pSrc_00->a[0].pTab;
            pTVar4->nTabRef = pTVar4->nTabRef + 1;
            iVar6 = *(int *)&pTab_local->iPKey;
            *(int *)&pTab_local->iPKey = iVar6 + 1;
            pSrc_00->a[0].iCursor = iVar6;
            if ((int)aChange_local != 0) {
              fkScanChildren((Parse *)pTab_local,pSrc_00,_regNew_local,(Index *)pSrc,pFStack_40,
                             (int *)pItem,(int)aChange_local,-1);
            }
            if (aChange_local._4_4_ != 0) {
              uVar1 = pFStack_40->aAction[(int)(uint)(piStack_28 != (int *)0x0)];
              fkScanChildren((Parse *)pTab_local,(SrcList *)aiCol_1,_regNew_local,(Index *)pSrc,
                             pFStack_40,(int *)pItem,aChange_local._4_4_,1);
              if (((pFStack_40->isDeferred == '\0') && (uVar1 != '\n')) && (uVar1 != '\b')) {
                sqlite3MayAbort((Parse *)pTab_local);
              }
            }
            pSrc_00->a[0].zName = (char *)0x0;
            sqlite3SrcListDelete((sqlite3 *)pFKey,(SrcList *)aiCol_1);
          }
          sqlite3DbFree((sqlite3 *)pFKey,pItem);
        }
        else {
          if (pTo._4_4_ == 0) {
            return;
          }
          if (*(char *)((long)&pFKey[1].zTo + 7) != '\0') {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkCheck(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Row is being deleted from this table */
  int regOld,                     /* Previous row data is stored here */
  int regNew,                     /* New row data is stored here */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  FKey *pFKey;                    /* Used to iterate through FKs */
  int iDb;                        /* Index of database containing pTab */
  const char *zDb;                /* Name of database containing pTab */
  int isIgnoreErrors = pParse->disableTriggers;

  /* Exactly one of regOld and regNew should be non-zero. */
  assert( (regOld==0)!=(regNew==0) );

  /* If foreign-keys are disabled, this function is a no-op. */
  if( (db->flags&SQLITE_ForeignKeys)==0 ) return;
  if( !IsOrdinaryTable(pTab) ) return;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  zDb = db->aDb[iDb].zDbSName;

  /* Loop through all the foreign key constraints for which pTab is the
  ** child table (the table that the foreign key definition is part of).  */
  for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
    Table *pTo;                   /* Parent table of foreign key pFKey */
    Index *pIdx = 0;              /* Index on key columns in pTo */
    int *aiFree = 0;
    int *aiCol;
    int iCol;
    int i;
    int bIgnore = 0;

    if( aChange
     && sqlite3_stricmp(pTab->zName, pFKey->zTo)!=0
     && fkChildIsModified(pTab, pFKey, aChange, bChngRowid)==0
    ){
      continue;
    }

    /* Find the parent table of this foreign key. Also find a unique index
    ** on the parent key columns in the parent table. If either of these
    ** schema items cannot be located, set an error in pParse and return
    ** early.  */
    if( pParse->disableTriggers ){
      pTo = sqlite3FindTable(db, pFKey->zTo, zDb);
    }else{
      pTo = sqlite3LocateTable(pParse, 0, pFKey->zTo, zDb);
    }
    if( !pTo || sqlite3FkLocateIndex(pParse, pTo, pFKey, &pIdx, &aiFree) ){
      assert( isIgnoreErrors==0 || (regOld!=0 && regNew==0) );
      if( !isIgnoreErrors || db->mallocFailed ) return;
      if( pTo==0 ){
        /* If isIgnoreErrors is true, then a table is being dropped. In this
        ** case SQLite runs a "DELETE FROM xxx" on the table being dropped
        ** before actually dropping it in order to check FK constraints.
        ** If the parent table of an FK constraint on the current table is
        ** missing, behave as if it is empty. i.e. decrement the relevant
        ** FK counter for each row of the current table with non-NULL keys.
        */
        Vdbe *v = sqlite3GetVdbe(pParse);
        int iJump = sqlite3VdbeCurrentAddr(v) + pFKey->nCol + 1;
        for(i=0; i<pFKey->nCol; i++){
          int iFromCol, iReg;
          iFromCol = pFKey->aCol[i].iFrom;
          iReg = sqlite3TableColumnToStorage(pFKey->pFrom,iFromCol) + regOld+1;
          sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iJump); VdbeCoverage(v);
        }
        sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, -1);
      }
      continue;
    }
    assert( pFKey->nCol==1 || (aiFree && pIdx) );

    if( aiFree ){
      aiCol = aiFree;
    }else{
      iCol = pFKey->aCol[0].iFrom;
      aiCol = &iCol;
    }
    for(i=0; i<pFKey->nCol; i++){
      if( aiCol[i]==pTab->iPKey ){
        aiCol[i] = -1;
      }
      assert( pIdx==0 || pIdx->aiColumn[i]>=0 );
#ifndef SQLITE_OMIT_AUTHORIZATION
      /* Request permission to read the parent key columns. If the
      ** authorization callback returns SQLITE_IGNORE, behave as if any
      ** values read from the parent table are NULL. */
      if( db->xAuth ){
        int rcauth;
        char *zCol = pTo->aCol[pIdx ? pIdx->aiColumn[i] : pTo->iPKey].zCnName;
        rcauth = sqlite3AuthReadCol(pParse, pTo->zName, zCol, iDb);
        bIgnore = (rcauth==SQLITE_IGNORE);
      }
#endif
    }

    /* Take a shared-cache advisory read-lock on the parent table. Allocate
    ** a cursor to use to search the unique index on the parent key columns
    ** in the parent table.  */
    sqlite3TableLock(pParse, iDb, pTo->tnum, 0, pTo->zName);
    pParse->nTab++;

    if( regOld!=0 ){
      /* A row is being removed from the child table. Search for the parent.
      ** If the parent does not exist, removing the child row resolves an
      ** outstanding foreign key constraint violation. */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regOld, -1, bIgnore);
    }
    if( regNew!=0 && !isSetNullAction(pParse, pFKey) ){
      /* A row is being added to the child table. If a parent row cannot
      ** be found, adding the child row has violated the FK constraint.
      **
      ** If this operation is being performed as part of a trigger program
      ** that is actually a "SET NULL" action belonging to this very
      ** foreign key, then omit this scan altogether. As all child key
      ** values are guaranteed to be NULL, it is not possible for adding
      ** this row to cause an FK violation.  */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regNew, +1, bIgnore);
    }

    sqlite3DbFree(db, aiFree);
  }

  /* Loop through all the foreign key constraints that refer to this table.
  ** (the "child" constraints) */
  for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
    Index *pIdx = 0;              /* Foreign key index for pFKey */
    SrcList *pSrc;
    int *aiCol = 0;

    if( aChange && fkParentIsModified(pTab, pFKey, aChange, bChngRowid)==0 ){
      continue;
    }

    if( !pFKey->isDeferred && !(db->flags & SQLITE_DeferFKs)
     && !pParse->pToplevel && !pParse->isMultiWrite
    ){
      assert( regOld==0 && regNew!=0 );
      /* Inserting a single row into a parent table cannot cause (or fix)
      ** an immediate foreign key violation. So do nothing in this case.  */
      continue;
    }

    if( sqlite3FkLocateIndex(pParse, pTab, pFKey, &pIdx, &aiCol) ){
      if( !isIgnoreErrors || db->mallocFailed ) return;
      continue;
    }
    assert( aiCol || pFKey->nCol==1 );

    /* Create a SrcList structure containing the child table.  We need the
    ** child table as a SrcList for sqlite3WhereBegin() */
    pSrc = sqlite3SrcListAppend(pParse, 0, 0, 0);
    if( pSrc ){
      SrcItem *pItem = pSrc->a;
      pItem->pTab = pFKey->pFrom;
      pItem->zName = pFKey->pFrom->zName;
      pItem->pTab->nTabRef++;
      pItem->iCursor = pParse->nTab++;

      if( regNew!=0 ){
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regNew, -1);
      }
      if( regOld!=0 ){
        int eAction = pFKey->aAction[aChange!=0];
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regOld, 1);
        /* If this is a deferred FK constraint, or a CASCADE or SET NULL
        ** action applies, then any foreign key violations caused by
        ** removing the parent key will be rectified by the action trigger.
        ** So do not set the "may-abort" flag in this case.
        **
        ** Note 1: If the FK is declared "ON UPDATE CASCADE", then the
        ** may-abort flag will eventually be set on this statement anyway
        ** (when this function is called as part of processing the UPDATE
        ** within the action trigger).
        **
        ** Note 2: At first glance it may seem like SQLite could simply omit
        ** all OP_FkCounter related scans when either CASCADE or SET NULL
        ** applies. The trouble starts if the CASCADE or SET NULL action
        ** trigger causes other triggers or action rules attached to the
        ** child table to fire. In these cases the fk constraint counters
        ** might be set incorrectly if any OP_FkCounter related scans are
        ** omitted.  */
        if( !pFKey->isDeferred && eAction!=OE_Cascade && eAction!=OE_SetNull ){
          sqlite3MayAbort(pParse);
        }
      }
      pItem->zName = 0;
      sqlite3SrcListDelete(db, pSrc);
    }
    sqlite3DbFree(db, aiCol);
  }
}